

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O1

void __thiscall
trun::TestRunner::AddDependenciesForModule
          (TestRunner *this,string *moduleName,string *dependencyList)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  Ref mod_dep;
  Ref tm;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deplist;
  Ref local_78;
  element_type *local_68;
  element_type *local_60;
  undefined1 local_58 [24];
  _Base_ptr p_Stack_40;
  _Base_ptr local_38;
  
  local_58._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Stack_40 = (_Base_ptr)0x0;
  local_38 = (_Base_ptr)0x0;
  split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)(local_58 + 0x10),(dependencyList->_M_dataplus)._M_p,0x2c);
  ModuleFromName((TestRunner *)local_58,(string *)this);
  p_Var1 = p_Stack_40;
  if ((TestModule *)local_58._0_8_ == (TestModule *)0x0) {
    gnilk::Log::Error<char_const*,char_const*>
              (this->pLogger,"Module not found; \'%s\'",(moduleName->_M_dataplus)._M_p);
  }
  else if ((_Base_ptr)local_58._16_8_ != p_Stack_40) {
    p_Var2 = (_Base_ptr)local_58._16_8_;
    do {
      ModuleFromName((TestRunner *)&local_68,(string *)this);
      if (local_68 == (element_type *)0x0) {
        gnilk::Log::Error<char_const*,char_const*>
                  (this->pLogger,"Module Dependency not found; \'%s\'",*(char **)p_Var2);
      }
      else {
        local_78.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
        local_78.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60;
        if (local_60 != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_60->version).prefix = *(int *)(local_60->version).prefix + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_60->version).prefix = *(int *)(local_60->version).prefix + 1;
          }
        }
        TestModule::AddDependency((TestModule *)local_58._0_8_,&local_78);
        if (local_78.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (local_60 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60);
      }
      p_Var2 = p_Var2 + 1;
    } while (p_Var2 != p_Var1);
  }
  if ((element_type *)local_58._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_58 + 0x10));
  return;
}

Assistant:

void TestRunner::AddDependenciesForModule(const std::string &moduleName, const std::string &dependencyList) {
    std::vector<std::string> deplist;
    trun::split(deplist, dependencyList.c_str(), ',');

    auto tm = ModuleFromName(moduleName);
    if (tm == nullptr) {
        pLogger->Error("Module not found; '%s'", moduleName.c_str());
        return;
    }
    for(auto &dep : deplist) {
        auto mod_dep = ModuleFromName(dep);
        if (mod_dep == nullptr) {
            pLogger->Error("Module Dependency not found; '%s'", dep.c_str());
            continue;
        }
        tm->AddDependency(mod_dep);
    }
}